

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O1

void __thiscall RationalNum::RationalNum(RationalNum *this,double x)

{
  long lVar1;
  ostream *poVar2;
  ulong denominator_;
  double dVar3;
  
  lVar1 = (long)x;
  denominator_ = 1;
  if (((double)lVar1 != x) || (NAN((double)lVar1) || NAN(x))) {
    do {
      if (0xccccccc < denominator_) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"this frational number : ",0x18);
        poVar2 = std::ostream::_M_insert<double>(x);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," can not be transfer to rational number, it\'s too long, now set it 0.",
                   0x45);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        this->numerator = 0;
        this->denominator = 1;
        return;
      }
      denominator_ = denominator_ * 10;
      lVar1 = (long)((double)(long)denominator_ * x);
      dVar3 = (double)(long)denominator_ * x - (double)lVar1;
    } while ((dVar3 != 0.0) || (NAN(dVar3)));
  }
  this->numerator = lVar1;
  setDenominator(this,denominator_);
  simplify(this);
  return;
}

Assistant:

RationalNum::RationalNum(double x) {
    long long int i = 1;
    while (x * i - static_cast<long long int>(x * i) != 0) {
        if (i > INT_MAX / 10) {
            cout << "this frational number : " << x
                 << " can not be transfer to rational number, it's too long, now set it 0." << endl;
            setNumerator(0);
            setDenominator(1);
            return;
        } else {
            i *= 10;
        }
    }
    setNumerator(x * i);
    setDenominator(i);
    simplify();
}